

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::btAxisSweep3Internal
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *worldAabbMin,
          btVector3 *worldAabbMax,unsigned_short handleMask,unsigned_short handleSentinel,
          unsigned_short userMaxHandles,btOverlappingPairCache *pairCache,
          bool disableRaycastAccelerator)

{
  Edge *pEVar1;
  undefined8 uVar2;
  btHashedOverlappingPairCache *this_00;
  btOverlappingPairCache *pbVar3;
  btDbvtBroadphase *this_01;
  Handle *pHVar4;
  void *pvVar5;
  undefined2 *puVar6;
  Handle *pHVar7;
  ulong uVar8;
  ushort uVar9;
  ulong uVar10;
  long lVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar12;
  undefined4 in_XMM2_Db;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  btVector3 bVar17;
  undefined1 auVar13 [16];
  
  (this->super_btBroadphaseInterface)._vptr_btBroadphaseInterface =
       (_func_int **)&PTR__btAxisSweep3Internal_001ebdf0;
  this->m_bpHandleMask = handleMask;
  this->m_handleSentinel = handleSentinel;
  this->m_pairCache = pairCache;
  this->m_userPairCallback = (btOverlappingPairCallback *)0x0;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  this->m_raycastAccelerator = (btDbvtBroadphase *)0x0;
  uVar9 = userMaxHandles + 1;
  if (pairCache == (btOverlappingPairCache *)0x0) {
    this_00 = (btHashedOverlappingPairCache *)btAlignedAllocInternal(0x78,0x10);
    btHashedOverlappingPairCache::btHashedOverlappingPairCache(this_00);
    this->m_pairCache = (btOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  if (!disableRaycastAccelerator) {
    pbVar3 = (btOverlappingPairCache *)btAlignedAllocInternal(0x28,0x10);
    pbVar3[3].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar3[4].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar3[1].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    pbVar3[2].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = (_func_int **)0x0;
    (pbVar3->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback =
         (_func_int **)&PTR__btNullPairCache_001ebe70;
    *(undefined1 *)&pbVar3[4].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback = 1;
    *(undefined4 *)
     ((long)&pbVar3[1].super_btOverlappingPairCallback._vptr_btOverlappingPairCallback + 4) = 0;
    this->m_nullPairCache = pbVar3;
    this_01 = (btDbvtBroadphase *)btAlignedAllocInternal(0x120,0x10);
    btDbvtBroadphase::btDbvtBroadphase(this_01,this->m_nullPairCache);
    this->m_raycastAccelerator = this_01;
    this_01->m_deferedcollide = true;
  }
  uVar2 = *(undefined8 *)(worldAabbMin->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMin).m_floats = *(undefined8 *)worldAabbMin->m_floats;
  *(undefined8 *)((this->m_worldAabbMin).m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)(worldAabbMax->m_floats + 2);
  *(undefined8 *)(this->m_worldAabbMax).m_floats = *(undefined8 *)worldAabbMax->m_floats;
  *(undefined8 *)((this->m_worldAabbMax).m_floats + 2) = uVar2;
  bVar17 = operator-(&this->m_worldAabbMax,&this->m_worldAabbMin);
  fVar12 = (float)this->m_handleSentinel;
  auVar14._4_4_ = in_XMM2_Db;
  auVar14._0_4_ = fVar12;
  auVar14._8_4_ = in_XMM2_Db;
  auVar14._12_4_ = in_XMM2_Db;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._4_4_ = fVar12;
  auVar13._0_4_ = fVar12;
  auVar15._8_4_ = extraout_XMM0_Dc;
  auVar15._0_8_ = bVar17.m_floats._0_8_;
  auVar15._12_4_ = extraout_XMM0_Dd;
  auVar15 = divps(auVar13,auVar15);
  auVar16._0_8_ = auVar15._0_8_;
  auVar16._8_4_ = fVar12 / bVar17.m_floats[2];
  auVar16._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_quantize).m_floats = auVar16;
  uVar10 = (ulong)(uint)uVar9;
  pHVar4 = (Handle *)Handle::operator_new__(uVar10 * 0x50);
  if (uVar9 != 0) {
    pHVar7 = pHVar4;
    do {
      (pHVar7->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
      (pHVar7->super_btBroadphaseProxy).m_multiSapParentProxy = (void *)0x0;
      pHVar7 = pHVar7 + 1;
    } while (pHVar7 != pHVar4 + uVar10);
  }
  this->m_pHandles = pHVar4;
  this->m_maxHandles = uVar9;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 1;
  puVar6 = (undefined2 *)&pHVar4[1].super_btBroadphaseProxy.field_0x3c;
  uVar8 = 1;
  while (uVar8 < uVar10) {
    uVar8 = uVar8 + 1;
    *puVar6 = (short)uVar8;
    puVar6 = puVar6 + 0x28;
  }
  *(undefined2 *)&pHVar4[uVar10 - 1].super_btBroadphaseProxy.field_0x3c = 0;
  for (lVar11 = -0x18; lVar11 != 0; lVar11 = lVar11 + 8) {
    pvVar5 = btAlignedAllocInternal((ulong)((uint)uVar9 * 8),0x10);
    *(void **)((long)this->m_pEdgesRawPtr + lVar11 + 0x18) = pvVar5;
    *(void **)((long)this->m_pEdgesRawPtr + lVar11) = pvVar5;
  }
  pHVar4 = this->m_pHandles;
  (pHVar4->super_btBroadphaseProxy).m_clientObject = (void *)0x0;
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    pHVar4->m_maxEdges[lVar11 + -3] = 0;
    pHVar4->m_maxEdges[lVar11] = 1;
    pEVar1 = this->m_pEdges[lVar11];
    pEVar1->m_pos = 0;
    pEVar1->m_handle = 0;
    pEVar1[1].m_pos = this->m_handleSentinel;
    pEVar1[1].m_handle = 0;
  }
  return;
}

Assistant:

btAxisSweep3Internal<BP_FP_INT_TYPE>::btAxisSweep3Internal(const btVector3& worldAabbMin,const btVector3& worldAabbMax, BP_FP_INT_TYPE handleMask, BP_FP_INT_TYPE handleSentinel,BP_FP_INT_TYPE userMaxHandles, btOverlappingPairCache* pairCache , bool disableRaycastAccelerator)
:m_bpHandleMask(handleMask),
m_handleSentinel(handleSentinel),
m_pairCache(pairCache),
m_userPairCallback(0),
m_ownsPairCache(false),
m_invalidPair(0),
m_raycastAccelerator(0)
{
	BP_FP_INT_TYPE maxHandles = static_cast<BP_FP_INT_TYPE>(userMaxHandles+1);//need to add one sentinel handle

	if (!m_pairCache)
	{
		void* ptr = btAlignedAlloc(sizeof(btHashedOverlappingPairCache),16);
		m_pairCache = new(ptr) btHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	if (!disableRaycastAccelerator)
	{
		m_nullPairCache = new (btAlignedAlloc(sizeof(btNullPairCache),16)) btNullPairCache();
		m_raycastAccelerator = new (btAlignedAlloc(sizeof(btDbvtBroadphase),16)) btDbvtBroadphase(m_nullPairCache);//m_pairCache);
		m_raycastAccelerator->m_deferedcollide = true;//don't add/remove pairs
	}

	//btAssert(bounds.HasVolume());

	// init bounds
	m_worldAabbMin = worldAabbMin;
	m_worldAabbMax = worldAabbMax;

	btVector3 aabbSize = m_worldAabbMax - m_worldAabbMin;

	BP_FP_INT_TYPE	maxInt = m_handleSentinel;

	m_quantize = btVector3(btScalar(maxInt),btScalar(maxInt),btScalar(maxInt)) / aabbSize;

	// allocate handles buffer, using btAlignedAlloc, and put all handles on free list
	m_pHandles = new Handle[maxHandles];
	
	m_maxHandles = maxHandles;
	m_numHandles = 0;

	// handle 0 is reserved as the null index, and is also used as the sentinel
	m_firstFreeHandle = 1;
	{
		for (BP_FP_INT_TYPE i = m_firstFreeHandle; i < maxHandles; i++)
			m_pHandles[i].SetNextFree(static_cast<BP_FP_INT_TYPE>(i + 1));
		m_pHandles[maxHandles - 1].SetNextFree(0);
	}

	{
		// allocate edge buffers
		for (int i = 0; i < 3; i++)
		{
			m_pEdgesRawPtr[i] = btAlignedAlloc(sizeof(Edge)*maxHandles*2,16);
			m_pEdges[i] = new(m_pEdgesRawPtr[i]) Edge[maxHandles * 2];
		}
	}
	//removed overlap management

	// make boundary sentinels
	
	m_pHandles[0].m_clientObject = 0;

	for (int axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_minEdges[axis] = 0;
		m_pHandles[0].m_maxEdges[axis] = 1;

		m_pEdges[axis][0].m_pos = 0;
		m_pEdges[axis][0].m_handle = 0;
		m_pEdges[axis][1].m_pos = m_handleSentinel;
		m_pEdges[axis][1].m_handle = 0;
#ifdef DEBUG_BROADPHASE
		debugPrintAxis(axis);
#endif //DEBUG_BROADPHASE

	}

}